

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O2

bool __thiscall rcg::Buffer::isBigEndian(Buffer *this)

{
  PDSGetBufferInfo p_Var1;
  GC_ERROR GVar2;
  void *pvVar3;
  bool bVar4;
  size_t size;
  int32_t v;
  INFO_DATATYPE type;
  
  size = 4;
  pvVar3 = Stream::getHandle(this->parent);
  if ((pvVar3 == (void *)0x0) || (this->buffer == (void *)0x0)) {
    bVar4 = false;
  }
  else {
    p_Var1 = ((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->DSGetBufferInfo;
    pvVar3 = Stream::getHandle(this->parent);
    GVar2 = (*p_Var1)(pvVar3,this->buffer,0x1a,&type,&v,&size);
    bVar4 = v == 2 && (type == 5 && GVar2 == 0);
  }
  return bVar4;
}

Assistant:

bool Buffer::isBigEndian() const
{
  bool ret=false;

  GenTL::INFO_DATATYPE type;
  int32_t v;
  size_t size=sizeof(v);
  GenTL::GC_ERROR err=GenTL::GC_ERR_SUCCESS;

  if (parent->getHandle() != 0 && buffer != 0)
  {
    err=gentl->DSGetBufferInfo(parent->getHandle(), buffer, GenTL::BUFFER_INFO_PIXEL_ENDIANNESS,
                               &type, &v, &size);

    if (err == GenTL::GC_ERR_SUCCESS && type == GenTL::INFO_DATATYPE_INT32 &&
        v == GenTL::PIXELENDIANNESS_BIG)
    {
      ret=true;
    }
  }

  return ret;
}